

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

StructReader * __thiscall capnp::_::StructBuilder::asReader(StructBuilder *this)

{
  StructPointerCount SVar1;
  StructDataBitCount SVar2;
  CapTableReader *pCVar3;
  void *pvVar4;
  WirePointer *pWVar5;
  StructReader *in_RDI;
  
  pCVar3 = &this->capTable->super_CapTableReader;
  pvVar4 = this->data;
  pWVar5 = this->pointers;
  SVar2 = this->dataSize;
  SVar1 = this->pointerCount;
  in_RDI->segment = &this->segment->super_SegmentReader;
  in_RDI->capTable = pCVar3;
  in_RDI->data = pvVar4;
  in_RDI->pointers = pWVar5;
  in_RDI->dataSize = SVar2;
  in_RDI->pointerCount = SVar1;
  in_RDI->nestingLimit = 0x7fffffff;
  return in_RDI;
}

Assistant:

StructReader StructBuilder::asReader() const {
  return StructReader(segment, capTable, data, pointers,
      dataSize, pointerCount, kj::maxValue);
}